

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O3

int cpu_scaling_max_freq(int cpu)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  int max_freq;
  char *filename;
  int local_1c;
  char *local_18;
  
  local_18 = (char *)0x0;
  iVar1 = asprintf(&local_18,"/sys/devices/system/cpu/cpu%d/cpufreq/scaling_max_freq",cpu);
  iVar2 = -1;
  if (iVar1 != -1) {
    __stream = fopen(local_18,"r");
    free(local_18);
    if (__stream != (FILE *)0x0) {
      iVar2 = __isoc99_fscanf(__stream,"%d",&local_1c);
      if (iVar2 != 1) {
        local_1c = -1;
      }
      fclose(__stream);
      iVar2 = local_1c;
    }
  }
  return iVar2;
}

Assistant:

int
cpu_scaling_max_freq(int cpu)
{
	int max_freq;
	FILE *fp;
	char *filename = NULL;
	if (asprintf(&filename,
		"/sys/devices/system/cpu/cpu%d/cpufreq/scaling_max_freq",
			cpu) == -1) {
		return -1;
	}
	fp = fopen(filename, "r");
	free(filename);
	if (!fp)
		return -1;
	if (fscanf(fp, "%d", &max_freq) != 1)
		max_freq = -1;
	fclose(fp);
	return max_freq;
}